

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_store(CompilerHLSL *this,Instruction *instruction)

{
  Variant *pVVar1;
  uint32_t *puVar2;
  ulong uVar3;
  SPIRAccessChain *chain;
  SmallVector<unsigned_int,_8UL> local_58;
  
  puVar2 = Compiler::stream((Compiler *)this,instruction);
  uVar3 = (ulong)*puVar2;
  if ((uVar3 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar3].type == TypeAccessChain)) {
    chain = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar3);
  }
  else {
    chain = (SPIRAccessChain *)0x0;
  }
  if (chain != (SPIRAccessChain *)0x0) {
    local_58.super_VectorView<unsigned_int>.buffer_size = 0;
    local_58.buffer_capacity = 8;
    local_58.super_VectorView<unsigned_int>.ptr = (uint *)&local_58.stack_storage;
    write_access_chain(this,chain,puVar2[1],&local_58);
    local_58.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_58.super_VectorView<unsigned_int>.ptr !=
        &local_58.stack_storage) {
      free(local_58.super_VectorView<unsigned_int>.ptr);
    }
    return;
  }
  CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
  return;
}

Assistant:

void CompilerHLSL::emit_store(const Instruction &instruction)
{
	auto ops = stream(instruction);
	auto *chain = maybe_get<SPIRAccessChain>(ops[0]);
	if (chain)
		write_access_chain(*chain, ops[1], {});
	else
		CompilerGLSL::emit_instruction(instruction);
}